

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

float nite::distancePointToLine(Vec2 *Point,Vec2 *P1,Vec2 *P2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  float dy;
  float dx;
  float yy;
  float xx;
  float Param;
  float lenSq;
  float Dot;
  float D;
  float C;
  float B;
  float A;
  Vec2 *P2_local;
  Vec2 *P1_local;
  Vec2 *Point_local;
  
  fVar6 = Point->x;
  fVar1 = P1->x;
  fVar2 = Point->y;
  fVar3 = P1->y;
  fVar4 = P2->x - P1->x;
  fVar5 = P2->y - P1->y;
  dVar7 = pow((double)fVar4,2.0);
  dVar8 = pow((double)fVar5,2.0);
  fVar6 = ((fVar6 - fVar1) * fVar4 + (fVar2 - fVar3) * fVar5) / (float)(dVar7 + dVar8);
  if (fVar6 < 0.0) {
LAB_002207f3:
    dx = P1->x;
    dy = P1->y;
  }
  else {
    if ((P1->x == P2->x) && (!NAN(P1->x) && !NAN(P2->x))) {
      if ((P1->y == P2->y) && (!NAN(P1->y) && !NAN(P2->y))) goto LAB_002207f3;
    }
    if (fVar6 <= 1.0) {
      dx = fVar6 * fVar4 + P1->x;
      dy = fVar6 * fVar5 + P1->y;
    }
    else {
      dx = P2->x;
      dy = P2->y;
    }
  }
  fVar6 = Point->y;
  dVar7 = pow((double)(Point->x - dx),2.0);
  dVar8 = pow((double)(fVar6 - dy),2.0);
  dVar7 = sqrt(dVar7 + dVar8);
  return (float)dVar7;
}

Assistant:

float nite::distancePointToLine(const nite::Vec2 &Point, const nite::Vec2 &P1, const nite::Vec2 &P2){
	float A = Point.x - P1.x;
	float B = Point.y - P1.y;
	float C = P2.x - P1.x;
	float D = P2.y - P1.y;
	float Dot = A*C+B*D;
	float lenSq = nite::pow(C, 2) + nite::pow(D, 2);
	float Param = Dot/lenSq;
	float xx, yy;
	if (Param < 0 || (P1.x == P2.x && P1.y == P2.y)){
		xx = P1.x;
		yy = P1.y;
	}else
	if (Param > 1){
		xx = P2.x;
		yy = P2.y;
	}else{
		xx = P1.x + Param * C;
		yy = P1.y + Param * D;
	}
	float dx = Point.x - xx;
	float dy = Point.y - yy;
	return nite::sqrt(nite::pow(dx, 2) + nite::pow(dy, 2));
}